

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_nodeid_mod_check
                 (lysc_ctx *ctx,char *str,ly_bool abs,ly_set *mod_set,lysc_nodeid **nodeid,
                 lys_module **target_mod)

{
  ly_ctx *ctx_00;
  LY_ERR LVar1;
  char *pcVar2;
  size_t expr_len;
  lys_module *object;
  uint local_6c;
  uint32_t i;
  char *nodeid_type;
  lys_module *mod;
  lys_module *tmod;
  lysc_nodeid *ni;
  lyxp_expr *e;
  lys_module **pplStack_38;
  LY_ERR ret;
  lys_module **target_mod_local;
  lysc_nodeid **nodeid_local;
  ly_set *mod_set_local;
  char *pcStack_18;
  ly_bool abs_local;
  char *str_local;
  lysc_ctx *ctx_local;
  
  e._4_4_ = 0;
  ni = (lysc_nodeid *)0x0;
  tmod = (lys_module *)0x0;
  mod = (lys_module *)0x0;
  pcVar2 = "descendant-schema-nodeid";
  if (abs != '\0') {
    pcVar2 = "absolute-schema-nodeid";
  }
  ctx_00 = ctx->ctx;
  pplStack_38 = target_mod;
  target_mod_local = (lys_module **)nodeid;
  nodeid_local = (lysc_nodeid **)mod_set;
  mod_set_local._7_1_ = abs;
  pcStack_18 = str;
  str_local = (char *)ctx;
  expr_len = strlen(str);
  e._4_4_ = lyxp_expr_parse(ctx_00,str,expr_len,'\0',(lyxp_expr **)&ni);
  if (e._4_4_ == LY_SUCCESS) {
    if (mod_set_local._7_1_ == '\0') {
      if (*(int *)ni->str != 10) {
        ly_vlog(*(ly_ctx **)str_local,(char *)0x0,LYVE_REFERENCE,
                "Invalid %s value \"%s\" - name test expected instead of \"%.*s\".",pcVar2,
                pcStack_18,*(undefined4 *)ni->name,(long)ni[1].prefix + (ulong)*(uint *)ni->prefix);
        e._4_4_ = LY_EVALID;
        goto LAB_0017abac;
      }
      local_6c = 1;
    }
    else {
      local_6c = 0;
    }
    for (; local_6c < *(uint *)&ni[1].str; local_6c = local_6c + 2) {
      if (*(int *)(ni->str + (ulong)local_6c * 4) != 0x14) {
        ly_vlog(*(ly_ctx **)str_local,(char *)0x0,LYVE_REFERENCE,
                "Invalid %s value \"%s\" - \"/\" expected instead of \"%.*s\".",pcVar2,pcStack_18,
                *(undefined4 *)((long)ni->name + (ulong)local_6c * 4),
                (long)ni[1].prefix + (ulong)*(uint *)((long)ni->prefix + (ulong)local_6c * 4));
        e._4_4_ = LY_EVALID;
        goto LAB_0017abac;
      }
      if (*(int *)&ni[1].str == local_6c + 1) {
        ly_vlog(*(ly_ctx **)str_local,(char *)0x0,LYVE_REFERENCE,
                "Invalid %s value \"%s\" - unexpected end of expression.",pcVar2,ni[1].prefix);
        e._4_4_ = LY_EVALID;
        goto LAB_0017abac;
      }
      if (*(int *)(ni->str + (ulong)(local_6c + 1) * 4) != 10) {
        ly_vlog(*(ly_ctx **)str_local,(char *)0x0,LYVE_REFERENCE,
                "Invalid %s value \"%s\" - name test expected instead of \"%.*s\".",pcVar2,
                pcStack_18,*(undefined4 *)((long)ni->name + (ulong)(local_6c + 1) * 4),
                (long)ni[1].prefix + (ulong)*(uint *)((long)ni->prefix + (ulong)(local_6c + 1) * 4))
        ;
        e._4_4_ = LY_EVALID;
        goto LAB_0017abac;
      }
    }
    if (((mod_set_local._7_1_ == '\0') &&
        (LVar1 = LY_SUCCESS, target_mod_local == (lys_module **)0x0)) ||
       (e._4_4_ = lys_precompile_nodeid(*(ly_ctx **)str_local,pcStack_18,(lysc_nodeid **)&tmod),
       LVar1 = e._4_4_, e._4_4_ == LY_SUCCESS)) {
      e._4_4_ = LVar1;
      if (mod_set_local._7_1_ != '\0') {
        for (local_6c = 0; local_6c < *(uint *)&tmod->ns; local_6c = local_6c + 1) {
          object = lys_schema_node_get_module
                             (*(ly_ctx **)str_local,*(char **)(tmod->name + (ulong)local_6c * 8),
                              *(lysp_module **)(str_local + 0x10));
          if (object == (lys_module *)0x0) {
            e._4_4_ = LY_EVALID;
            goto LAB_0017abac;
          }
          if (mod == (lys_module *)0x0) {
            mod = object;
          }
          e._4_4_ = ly_set_add((ly_set *)nodeid_local,object,'\0',(uint32_t *)0x0);
          if (e._4_4_ != LY_SUCCESS) goto LAB_0017abac;
        }
      }
      if (target_mod_local != (lys_module **)0x0) {
        *target_mod_local = tmod;
        tmod = (lys_module *)0x0;
      }
      if (pplStack_38 != (lys_module **)0x0) {
        *pplStack_38 = mod;
      }
    }
  }
  else {
    ly_vlog(*(ly_ctx **)str_local,(char *)0x0,LYVE_SYNTAX_YANG,
            "Invalid %s value \"%s\" - invalid syntax.",pcVar2,pcStack_18);
    e._4_4_ = LY_EVALID;
  }
LAB_0017abac:
  lyxp_expr_free(*(ly_ctx **)str_local,(lyxp_expr *)ni);
  lysc_nodeid_free(*(ly_ctx **)str_local,(lysc_nodeid *)tmod);
  return e._4_4_;
}

Assistant:

static LY_ERR
lys_nodeid_mod_check(struct lysc_ctx *ctx, const char *str, ly_bool abs, struct ly_set *mod_set,
        struct lysc_nodeid **nodeid, struct lys_module **target_mod)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_expr *e = NULL;
    struct lysc_nodeid *ni = NULL;
    struct lys_module *tmod = NULL, *mod;
    const char *nodeid_type = abs ? "absolute-schema-nodeid" : "descendant-schema-nodeid";
    uint32_t i;

    /* parse */
    ret = lyxp_expr_parse(ctx->ctx, str, strlen(str), 0, &e);
    if (ret) {
        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "Invalid %s value \"%s\" - invalid syntax.", nodeid_type, str);
        ret = LY_EVALID;
        goto cleanup;
    }

    if (abs) {
        /* absolute schema nodeid */
        i = 0;
    } else {
        /* descendant schema nodeid */
        if (e->tokens[0] != LYXP_TOKEN_NAMETEST) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid %s value \"%s\" - name test expected instead of \"%.*s\".",
                    nodeid_type, str, (int)e->tok_len[0], e->expr + e->tok_pos[0]);
            ret = LY_EVALID;
            goto cleanup;
        }
        i = 1;
    }

    /* check all the tokens */
    for ( ; i < e->used; i += 2) {
        if (e->tokens[i] != LYXP_TOKEN_OPER_PATH) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid %s value \"%s\" - \"/\" expected instead of \"%.*s\".",
                    nodeid_type, str, (int)e->tok_len[i], e->expr + e->tok_pos[i]);
            ret = LY_EVALID;
            goto cleanup;
        } else if (e->used == i + 1) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE,
                    "Invalid %s value \"%s\" - unexpected end of expression.", nodeid_type, e->expr);
            ret = LY_EVALID;
            goto cleanup;
        } else if (e->tokens[i + 1] != LYXP_TOKEN_NAMETEST) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid %s value \"%s\" - name test expected instead of \"%.*s\".",
                    nodeid_type, str, (int)e->tok_len[i + 1], e->expr + e->tok_pos[i + 1]);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    if (abs || nodeid) {
        /* compile into nodeid, only if needed */
        LY_CHECK_GOTO(ret = lys_precompile_nodeid(ctx->ctx, str, &ni), cleanup);
    }

    if (abs) {
        for (i = 0; i < ni->count; ++i) {
            mod = (struct lys_module *)lys_schema_node_get_module(ctx->ctx, ni->prefix[i], ctx->pmod);
            LY_CHECK_ERR_GOTO(!mod, ret = LY_EVALID, cleanup);

            /* only keep the first module */
            if (!tmod) {
                tmod = mod;
            }

            /* store the referenced module */
            LY_CHECK_GOTO(ret = ly_set_add(mod_set, mod, 0, NULL), cleanup);
        }
    }

    if (nodeid) {
        *nodeid = ni;
        ni = NULL;
    }
    if (target_mod) {
        *target_mod = tmod;
    }

cleanup:
    lyxp_expr_free(ctx->ctx, e);
    lysc_nodeid_free(ctx->ctx, ni);
    return ret;
}